

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_header.cpp
# Opt level: O0

void __thiscall pstore::header::header(header *this)

{
  bool bVar1;
  uint32_t uVar2;
  reference pvVar3;
  header *this_local;
  
  body::body(&this->a);
  this->crc = 0;
  this->unused1 = 0;
  memset(&this->footer_pos,0,8);
  std::atomic<pstore::typed_address<pstore::trailer>_>::atomic(&this->footer_pos);
  bVar1 = std::atomic<pstore::typed_address<pstore::trailer>_>::is_lock_free(&this->footer_pos);
  if (!bVar1) {
    assert_failed("footer_pos.is_lock_free ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/file_header.cpp"
                  ,0x31);
  }
  *(undefined4 *)(this->a).signature1._M_elems = 0x72745370;
  (this->a).signature2 = 0x507ffff;
  pvVar3 = std::array<unsigned_short,_2UL>::operator[](&(this->a).version,0);
  *pvVar3 = 1;
  pvVar3 = std::array<unsigned_short,_2UL>::operator[](&(this->a).version,1);
  *pvVar3 = 0xd;
  uVar2 = get_crc(this);
  this->crc = uVar2;
  return;
}

Assistant:

header::header ()
            : footer_pos () {

        PSTORE_STATIC_ASSERT (sizeof (file_signature1[0]) == sizeof (a.signature1[0]));
        PSTORE_STATIC_ASSERT (sizeof (file_signature1) == sizeof (a.signature1));
        PSTORE_ASSERT (footer_pos.is_lock_free ());

        a.signature1 = file_signature1;
        a.signature2 = file_signature2;
        a.version[0] = header::major_version;
        a.version[1] = header::minor_version;
        crc = this->get_crc ();
    }